

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagTransferfunction(TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir)

{
  uint uVar1;
  int iVar2;
  uint16_t *value;
  int local_40;
  int i;
  int p;
  uint16_t *o;
  uint16_t n;
  uint32_t m;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else {
    uVar1 = 1 << ((byte)(tif->tif_dir).td_bitspersample & 0x1f);
    o._2_2_ = 1;
    if (1 < (int)((uint)(tif->tif_dir).td_samplesperpixel - (uint)(tif->tif_dir).td_extrasamples)) {
      o._2_2_ = 3;
    }
    for (local_40 = 0; local_40 < (int)(uint)o._2_2_; local_40 = local_40 + 1) {
      if ((tif->tif_dir).td_transferfunction[local_40] == (uint16_t *)0x0) {
        TIFFWarningExtR(tif,"TIFFWriteDirectoryTagTransferfunction",
                        "Too few TransferFunctions provided. Tag not written to file");
        return 1;
      }
    }
    if (((o._2_2_ == 3) &&
        (iVar2 = _TIFFmemcmp((tif->tif_dir).td_transferfunction[0],
                             (tif->tif_dir).td_transferfunction[2],(ulong)uVar1 << 1), iVar2 == 0))
       && (iVar2 = _TIFFmemcmp((tif->tif_dir).td_transferfunction[0],
                               (tif->tif_dir).td_transferfunction[1],(ulong)uVar1 << 1), iVar2 == 0)
       ) {
      o._2_2_ = 1;
    }
    value = (uint16_t *)_TIFFmallocExt(tif,(ulong)(o._2_2_ * uVar1) << 1);
    if (value == (uint16_t *)0x0) {
      TIFFErrorExtR(tif,"TIFFWriteDirectoryTagTransferfunction","Out of memory");
      tif_local._4_4_ = 0;
    }
    else {
      _TIFFmemcpy(value,(tif->tif_dir).td_transferfunction[0],(ulong)uVar1 << 1);
      if (1 < o._2_2_) {
        _TIFFmemcpy(value + uVar1,(tif->tif_dir).td_transferfunction[1],(ulong)uVar1 << 1);
      }
      if (2 < o._2_2_) {
        _TIFFmemcpy(value + (uVar1 << 1),(tif->tif_dir).td_transferfunction[2],(ulong)uVar1 << 1);
      }
      tif_local._4_4_ =
           TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,0x12d,o._2_2_ * uVar1,value);
      _TIFFfreeExt(tif,value);
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagTransferfunction(TIFF *tif, uint32_t *ndir,
                                                 TIFFDirEntry *dir)
{
    static const char module[] = "TIFFWriteDirectoryTagTransferfunction";
    uint32_t m;
    uint16_t n;
    uint16_t *o;
    int p;
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    /* TIFFTAG_TRANSFERFUNCTION expects (1 or 3) pointer to arrays with
     *  (1 << BitsPerSample) * uint16_t values.
     */
    m = (1 << tif->tif_dir.td_bitspersample);
    /* clang-format off */
    n = (tif->tif_dir.td_samplesperpixel - tif->tif_dir.td_extrasamples) > 1 ? 3 : 1;
    /* clang-format on */

    /* Check for proper number of transferfunctions */
    for (int i = 0; i < n; i++)
    {
        if (tif->tif_dir.td_transferfunction[i] == NULL)
        {
            TIFFWarningExtR(
                tif, module,
                "Too few TransferFunctions provided. Tag not written to file");
            return (1); /* Not an error; only tag is not written. */
        }
    }
    /*
     * Check if the table can be written as a single column,
     * or if it must be written as 3 columns.  Note that we
     * write a 3-column tag if there are 2 samples/pixel and
     * a single column of data won't suffice--hmm.
     */
    if (n == 3)
    {
        if (!_TIFFmemcmp(tif->tif_dir.td_transferfunction[0],
                         tif->tif_dir.td_transferfunction[2],
                         m * sizeof(uint16_t)) &&
            !_TIFFmemcmp(tif->tif_dir.td_transferfunction[0],
                         tif->tif_dir.td_transferfunction[1],
                         m * sizeof(uint16_t)))
            n = 1;
    }
    o = _TIFFmallocExt(tif, n * m * sizeof(uint16_t));
    if (o == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }
    _TIFFmemcpy(&o[0], tif->tif_dir.td_transferfunction[0],
                m * sizeof(uint16_t));
    if (n > 1)
        _TIFFmemcpy(&o[m], tif->tif_dir.td_transferfunction[1],
                    m * sizeof(uint16_t));
    if (n > 2)
        _TIFFmemcpy(&o[2 * m], tif->tif_dir.td_transferfunction[2],
                    m * sizeof(uint16_t));
    p = TIFFWriteDirectoryTagCheckedShortArray(
        tif, ndir, dir, TIFFTAG_TRANSFERFUNCTION, n * m, o);
    _TIFFfreeExt(tif, o);
    return (p);
}